

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O2

void test::LogTonkStatus(SDKConnection *connection)

{
  ostringstream *this;
  ostream *poVar1;
  OutputWorker *this_00;
  TonkStatus status;
  TonkStatusEx statusEx;
  ostringstream ss;
  TonkStatus local_3c8;
  string local_3b0 [32];
  TonkStatusEx local_390;
  ostringstream local_310 [376];
  LogStringBuffer local_198;
  
  tonk::SDKConnection::GetStatus(&local_3c8,connection);
  tonk::SDKConnection::GetStatusEx(&local_390,connection);
  std::__cxx11::ostringstream::ostringstream(local_310);
  if ((local_3c8.Flags >> 0x18 & 1) != 0) {
    std::operator<<((ostream *)local_310,"TonkFlag_Connecting ");
  }
  if ((local_3c8.Flags >> 0x19 & 1) != 0) {
    std::operator<<((ostream *)local_310,"TonkFlag_Connected ");
  }
  if ((local_3c8.Flags >> 0x1a & 1) != 0) {
    std::operator<<((ostream *)local_310,"TonkFlag_Disconnected ");
  }
  if ((local_3c8.Flags >> 0x1c & 1) != 0) {
    std::operator<<((ostream *)local_310,"TonkFlag_Initiated ");
  }
  if ((local_3c8.Flags & 1) != 0) {
    std::operator<<((ostream *)local_310,"TonkFlag_TimeSync ");
  }
  if ((local_3c8.Flags >> 8 & 1) != 0) {
    std::operator<<((ostream *)local_310,"TonkFlag_NATMap_Local ");
  }
  if ((local_3c8.Flags >> 9 & 1) != 0) {
    std::operator<<((ostream *)local_310,"TonkFlag_NATMap_Remote ");
  }
  poVar1 = std::operator<<((ostream *)local_310," AppBPS=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)local_310," ReliableQueueMsec=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)local_310," LowPriQueueMsec=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)local_310," RemoteId=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)local_310," LocalId=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (local_390.LocalNATMapExternalPort != 0) {
    poVar1 = std::operator<<((ostream *)local_310," LocalUPnPPort=");
    std::ostream::operator<<(poVar1,local_390.LocalNATMapExternalPort);
  }
  if (local_390.RemoteNATMapExternalPort != 0) {
    poVar1 = std::operator<<((ostream *)local_310," RemoteUPnPPort=");
    std::ostream::operator<<(poVar1,local_390.RemoteNATMapExternalPort);
  }
  poVar1 = std::operator<<((ostream *)local_310," Self=");
  poVar1 = std::operator<<(poVar1,local_390.Local.NetworkString);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,local_390.Local.UDPPort);
  poVar1 = std::operator<<((ostream *)local_310," Remote=");
  poVar1 = std::operator<<(poVar1,local_390.Remote.NetworkString);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,local_390.Remote.UDPPort);
  poVar1 = std::operator<<((ostream *)local_310," PeerSeenBPS=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)local_310," PeerSeenLossRate=");
  std::ostream::operator<<(poVar1,local_390.PeerSeenLossRate);
  poVar1 = std::operator<<((ostream *)local_310," IncomingBPS=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)local_310," IncomingLossRate=");
  std::ostream::operator<<(poVar1,local_390.IncomingLossRate);
  poVar1 = std::operator<<((ostream *)local_310," TripUsec=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  if (DAT_0010f268 < 3) {
    this = &local_198.LogStream;
    local_198.ChannelName = Logger;
    local_198.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,(string *)&DAT_0010f298);
    std::operator<<((ostream *)this,"tonk_status: ");
    std::operator<<((ostream *)this,local_3b0);
    this_00 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  return;
}

Assistant:

void LogTonkStatus(tonk::SDKConnection* connection)
{
    TonkStatus status = connection->GetStatus();
    TonkStatusEx statusEx = connection->GetStatusEx();

    std::ostringstream ss;
    if (status.Flags & TonkFlag_Connecting) {
        ss << "TonkFlag_Connecting ";
    }
    if (status.Flags & TonkFlag_Connected) {
        ss << "TonkFlag_Connected ";
    }
    if (status.Flags & TonkFlag_Disconnected) {
        ss << "TonkFlag_Disconnected ";
    }
    if (status.Flags & TonkFlag_Initiated) {
        ss << "TonkFlag_Initiated ";
    }
    if (status.Flags & TonkFlag_TimeSync) {
        ss << "TonkFlag_TimeSync ";
    }
    if (status.Flags & TonkFlag_NATMap_Local) {
        ss << "TonkFlag_NATMap_Local ";
    }
    if (status.Flags & TonkFlag_NATMap_Remote) {
        ss << "TonkFlag_NATMap_Remote ";
    }
    ss << " AppBPS=" << status.AppBPS;
    ss << " ReliableQueueMsec=" << status.ReliableQueueMsec;
    ss << " LowPriQueueMsec=" << status.LowPriQueueMsec;
    //ss << " ConnectionKey=" << statusEx.ConnectionKey;
    ss << " RemoteId=" << status.LocallyAssignedIdForRemoteHost;
    ss << " LocalId=" << statusEx.RemoteAssignedIdForLocalHost;
    if (statusEx.LocalNATMapExternalPort != 0) {
        ss << " LocalUPnPPort=" << statusEx.LocalNATMapExternalPort;
    }
    if (statusEx.RemoteNATMapExternalPort != 0) {
        ss << " RemoteUPnPPort=" << statusEx.RemoteNATMapExternalPort;
    }
    ss << " Self=" << statusEx.Local.NetworkString << ":" << statusEx.Local.UDPPort;
    ss << " Remote=" << statusEx.Remote.NetworkString << ":" << statusEx.Remote.UDPPort;
    ss << " PeerSeenBPS=" << statusEx.PeerSeenBPS;
    ss << " PeerSeenLossRate=" << statusEx.PeerSeenLossRate;
    ss << " IncomingBPS=" << statusEx.IncomingBPS;
    ss << " IncomingLossRate=" << statusEx.IncomingLossRate;
    ss << " TripUsec=" << statusEx.TripUsec;
    Logger.Info("tonk_status: ", ss.str());
}